

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_highlight_args(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uVar6;
  undefined8 uVar5;
  undefined4 uVar7;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 uVar9;
  undefined8 uVar8;
  undefined4 uVar10;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar12;
  undefined8 uVar11;
  char *pcStack_70;
  int argc;
  char *s;
  char *args [8];
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)(args + 7),0,"program");
  if (iVar1 == 0) {
    memcpy(&s,&DAT_0013e460,0x40);
    pcStack_70 = (char *)0x0;
    printf("With color highlight & args:\n");
    printf("----------------------------\n");
    uVar5 = CONCAT44(uVar6,1);
    uVar8 = CONCAT44(uVar9,3);
    uVar11 = CONCAT44(uVar12,4);
    iVar1 = cargo_fprint_args(_stdout,8,&s,1,0,0x50,3,uVar5,"^\x1b[22;31m",uVar8,"~\x1b[22;32m",
                              uVar11,"-");
    uVar12 = (undefined4)((ulong)uVar11 >> 0x20);
    uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    if (iVar1 == 0) {
      printf("With highlight & args:\n");
      printf("----------------------\n");
      uVar5 = CONCAT44(uVar6,1);
      uVar8 = CONCAT44(uVar9,3);
      uVar11 = CONCAT44(uVar12,4);
      iVar1 = cargo_fprint_args(_stdout,8,&s,1,CARGO_FPRINT_NOCOLOR,0x50,3,uVar5,"^\x1b[22;31m",
                                uVar8,"~\x1b[22;32m",uVar11,"-");
      uVar12 = (undefined4)((ulong)uVar11 >> 0x20);
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
      if (iVar1 == 0) {
        printf("With highlight & no args:\n");
        printf("-------------------------\n");
        uVar5 = CONCAT44(uVar6,1);
        uVar8 = CONCAT44(uVar9,3);
        uVar11 = CONCAT44(uVar12,4);
        iVar1 = cargo_fprint_args(_stdout,8,&s,1,CARGO_FPRINT_NOARGS,0x50,3,uVar5,"^\x1b[22;31m",
                                  uVar8,"~\x1b[22;32m",uVar11,"-");
        uVar12 = (undefined4)((ulong)uVar11 >> 0x20);
        uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
        uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
        if (iVar1 == 0) {
          printf("With no highlight & args:\n");
          printf("-------------------------\n");
          uVar4 = 0;
          uVar7 = 0;
          uVar10 = 0;
          iVar1 = cargo_fprint_args(_stdout,8,&s,1,CARGO_FPRINT_NOHIGHLIGHT,0x50,3,CONCAT44(uVar6,1)
                                    ,"^\x1b[22;31m",CONCAT44(uVar9,3),"~\x1b[22;32m",
                                    CONCAT44(uVar12,4),"-");
          if (iVar1 == 0) {
            printf("With default & not ordered:\n");
            printf("-------------------------\n");
            pcStack_70 = cargo_get_fprint_args
                                   (8,&s,1,0,0x50,3,CONCAT44(uVar4,3),"~\x1b[22;32m",
                                    CONCAT44(uVar7,1),"^\x1b[22;31m",CONCAT44(uVar10,4),"-");
            if (pcStack_70 == (char *)0x0) {
              pcStack_18 = "Failed call cargo_get_fprint_args";
            }
            else {
              printf("%s\n",pcStack_70);
              pcVar2 = strstr(pcStack_70,"~~~~~~");
              if (pcVar2 == (char *)0x0) {
                pcStack_18 = "Did not find highlight for --beta";
              }
              else {
                pcVar2 = strstr(pcStack_70,"^^^^^^^");
                if (pcVar2 == (char *)0x0) {
                  pcStack_18 = "Did not find highlight for --alpha";
                }
                else {
                  pcVar2 = strstr(pcStack_70,"---");
                  if (pcVar2 == (char *)0x0) {
                    pcStack_18 = "Did not find highlight for \'def\'";
                  }
                  else {
                    pcVar2 = strstr(pcStack_70,"^^^^^^^");
                    pcVar3 = strstr(pcStack_70,"---");
                    if (pcVar3 <= pcVar2) {
                      pcStack_18 = "--beta highlight after --alpha";
                    }
                  }
                }
              }
            }
          }
          else {
            pcStack_18 = "Failed call cargo_fprint_args";
          }
        }
        else {
          pcStack_18 = "Failed call cargo_fprint_args";
        }
      }
      else {
        pcStack_18 = "Failed call cargo_fprint_args";
      }
    }
    else {
      pcStack_18 = "Failed call cargo_fprint_args";
    }
    _cargo_xfree(&stack0xffffffffffffff90);
    cargo_destroy((cargo_t *)(args + 7));
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_highlight_args)
{
    char *args[] =
    {
        "program",
        "--alpha", "abc",
        "--beta", "def", "ghi",
        "--crazy", "banans"
    };
    char *s = NULL;
    int argc = sizeof(args) / sizeof(args[0]);

    printf("With color highlight & args:\n");
    printf("----------------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        0, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED,
                        3, "~"CARGO_COLOR_GREEN,
                        4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With highlight & args:\n");
    printf("----------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        CARGO_FPRINT_NOCOLOR, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED,
                        3, "~"CARGO_COLOR_GREEN,
                        4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With highlight & no args:\n");
    printf("-------------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        CARGO_FPRINT_NOARGS, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED, 3, "~"CARGO_COLOR_GREEN, 4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With no highlight & args:\n");
    printf("-------------------------\n");
    ret = cargo_fprint_args(stdout,
                        argc,
                        args,
                        1, // Start index.
                        CARGO_FPRINT_NOHIGHLIGHT, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        1, "^"CARGO_COLOR_RED, 3, "~"CARGO_COLOR_GREEN, 4, "-");
    cargo_assert(ret == 0, "Failed call cargo_fprint_args");

    printf("With default & not ordered:\n");
    printf("-------------------------\n");
    s = cargo_get_fprint_args(
                        argc,
                        args,
                        1, // Start index.
                        0, // flags
                        CARGO_DEFAULT_MAX_WIDTH,
                        3, // Highlight count.
                        3, "~"CARGO_COLOR_GREEN, 1, "^"CARGO_COLOR_RED, 4, "-");
    cargo_assert(s, "Failed call cargo_get_fprint_args");
    printf("%s\n", s);
    cargo_assert(strstr(s, "~~~~~~"), "Did not find highlight for --beta");
    cargo_assert(strstr(s, "^^^^^^^"), "Did not find highlight for --alpha");
    cargo_assert(strstr(s, "---"), "Did not find highlight for 'def'");
    cargo_assert(strstr(s, "^^^^^^^") < strstr(s, "---"),
        "--beta highlight after --alpha");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}